

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool container_iterator_next
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint16_t *value)

{
  ushort uVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined7 in_register_00000031;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar8;
  
  iVar5 = (int)CONCAT71(in_register_00000031,typecode);
  if (iVar5 == 3) {
    uVar1 = *value;
    if (uVar1 != 0xffff) {
      lVar2 = *(long *)((long)c + 8);
      lVar10 = (long)it->index;
      uVar7 = (uint)*(ushort *)(lVar2 + 2 + lVar10 * 4) + (uint)*(ushort *)(lVar2 + lVar10 * 4);
      if (uVar7 < uVar1 || uVar7 == uVar1) {
        iVar5 = it->index + 1;
        it->index = iVar5;
        if (*c <= iVar5) {
          return false;
        }
        uVar7 = (uint)*(ushort *)(lVar2 + 4 + lVar10 * 4);
      }
      else {
        uVar7 = uVar1 + 1;
      }
LAB_0011210f:
      *value = (uint16_t)uVar7;
      return true;
    }
  }
  else if (iVar5 == 2) {
    iVar5 = it->index;
    iVar6 = iVar5 + 1;
    it->index = iVar6;
    if (iVar6 < *c) {
      uVar7 = (uint)*(ushort *)(*(long *)((long)c + 8) + 2 + (long)iVar5 * 2);
      goto LAB_0011210f;
    }
  }
  else {
    iVar6 = it->index;
    iVar5 = iVar6 + 1;
    iVar4 = iVar6 + 0x40;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    it->index = iVar5;
    uVar7 = iVar4 >> 6;
    uVar8 = (ulong)uVar7;
    if (uVar7 < 0x400) {
      bVar3 = (char)iVar6 + 1;
      uVar9 = (*(ulong *)(*(long *)((long)c + 8) + (ulong)uVar7 * 8) >> (bVar3 & 0x3f)) <<
              (bVar3 & 0x3f);
      uVar11 = (ulong)uVar7;
      if (iVar6 - 0xffffU < 0xffffffc0 && uVar9 == 0) {
        do {
          uVar8 = uVar11 + 1;
          uVar9 = *(ulong *)(*(long *)((long)c + 8) + 8 + uVar11 * 8);
          if (uVar9 != 0) break;
          bVar12 = uVar11 < 0x3fe;
          uVar11 = uVar8;
        } while (bVar12);
      }
      if (uVar9 != 0) {
        lVar2 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar7 = (uint)lVar2 | (int)uVar8 << 6;
        it->index = uVar7;
        goto LAB_0011210f;
      }
    }
  }
  return false;
}

Assistant:

bool container_iterator_next(const container_t *c, uint8_t typecode,
                             roaring_container_iterator_t *it,
                             uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index++;

            uint32_t wordindex = it->index / 64;
            if (wordindex >= BITSET_CONTAINER_SIZE_IN_WORDS) {
                return false;
            }

            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX << (it->index % 64));
            // next part could be optimized/simplified
            while (word == 0 &&
                   (wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS)) {
                wordindex++;
                word = bc->words[wordindex];
            }
            if (word != 0) {
                it->index = wordindex * 64 + roaring_trailing_zeroes(word);
                *value = it->index;
                return true;
            }
            return false;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index++;
            if (it->index < ac->cardinality) {
                *value = ac->array[it->index];
                return true;
            }
            return false;
        }
        case RUN_CONTAINER_TYPE: {
            if (*value == UINT16_MAX) {  // Avoid overflow to zero
                return false;
            }

            const run_container_t *rc = const_CAST_run(c);
            uint32_t limit =
                rc->runs[it->index].value + rc->runs[it->index].length;
            if (*value < limit) {
                (*value)++;
                return true;
            }

            it->index++;
            if (it->index < rc->n_runs) {
                *value = rc->runs[it->index].value;
                return true;
            }
            return false;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}